

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_get_declared_extensions
          (spvc_compiler compiler,char ***extensions,size_t *num_extensions)

{
  spvc_context psVar1;
  pointer this;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pTVar4;
  char **ppcVar5;
  exception *e;
  unique_ptr<TemporaryBuffer<const_char_*>,_std::default_delete<TemporaryBuffer<const_char_*>_>_>
  local_c8;
  unique_ptr<TemporaryBuffer<const_char_*>,_std::default_delete<TemporaryBuffer<const_char_*>_>_>
  ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1;
  SmallVector<const_char_*,_8UL> duped;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *exts;
  size_t *num_extensions_local;
  char ***extensions_local;
  spvc_compiler compiler_local;
  
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  this_00 = spirv_cross::Compiler::get_declared_extensions_abi_cxx11_(this);
  spirv_cross::SmallVector<const_char_*,_8UL>::SmallVector
            ((SmallVector<const_char_*,_8UL> *)&__range1);
  sVar2 = spirv_cross::
          VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this_00->
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  spirv_cross::SmallVector<const_char_*,_8UL>::reserve
            ((SmallVector<const_char_*,_8UL> *)&__range1,sVar2);
  __end1 = spirv_cross::
           VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(&this_00->
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
  pbVar3 = spirv_cross::
           VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&this_00->
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  for (; __end1 != pbVar3; __end1 = __end1 + 1) {
    ptr._M_t.
    super___uniq_ptr_impl<TemporaryBuffer<const_char_*>,_std::default_delete<TemporaryBuffer<const_char_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TemporaryBuffer<const_char_*>_*,_std::default_delete<TemporaryBuffer<const_char_*>_>_>
    .super__Head_base<0UL,_TemporaryBuffer<const_char_*>_*,_false>._M_head_impl =
         (__uniq_ptr_data<TemporaryBuffer<const_char_*>,_std::default_delete<TemporaryBuffer<const_char_*>_>,_true,_true>
          )spvc_context_s::allocate_name(compiler->context,__end1);
    spirv_cross::SmallVector<const_char_*,_8UL>::push_back
              ((SmallVector<const_char_*,_8UL> *)&__range1,(char **)&ptr);
  }
  spvc_allocate<TemporaryBuffer<char_const*>>();
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<const_char_*>,_std::default_delete<TemporaryBuffer<const_char_*>_>_>
           ::operator->(&local_c8);
  spirv_cross::SmallVector<const_char_*,_8UL>::operator=
            (&pTVar4->buffer,(SmallVector<const_char_*,_8UL> *)&__range1);
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<const_char_*>,_std::default_delete<TemporaryBuffer<const_char_*>_>_>
           ::operator->(&local_c8);
  ppcVar5 = spirv_cross::VectorView<const_char_*>::data
                      (&(pTVar4->buffer).super_VectorView<const_char_*>);
  *extensions = ppcVar5;
  pTVar4 = std::
           unique_ptr<TemporaryBuffer<const_char_*>,_std::default_delete<TemporaryBuffer<const_char_*>_>_>
           ::operator->(&local_c8);
  sVar2 = spirv_cross::VectorView<const_char_*>::size
                    (&(pTVar4->buffer).super_VectorView<const_char_*>);
  *num_extensions = sVar2;
  psVar1 = compiler->context;
  std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>::
  unique_ptr<TemporaryBuffer<char_const*>,std::default_delete<TemporaryBuffer<char_const*>>,void>
            ((unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>> *)&e,
             &local_c8);
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&psVar1->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>::
  ~unique_ptr((unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              &e);
  std::
  unique_ptr<TemporaryBuffer<const_char_*>,_std::default_delete<TemporaryBuffer<const_char_*>_>_>::
  ~unique_ptr(&local_c8);
  spirv_cross::SmallVector<const_char_*,_8UL>::~SmallVector
            ((SmallVector<const_char_*,_8UL> *)&__range1);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_declared_extensions(spvc_compiler compiler, const char ***extensions,
                                                  size_t *num_extensions)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto &exts = compiler->compiler->get_declared_extensions();
		SmallVector<const char *> duped;
		duped.reserve(exts.size());
		for (auto &ext : exts)
			duped.push_back(compiler->context->allocate_name(ext));

		auto ptr = spvc_allocate<TemporaryBuffer<const char *>>();
		ptr->buffer = std::move(duped);
		*extensions = ptr->buffer.data();
		*num_extensions = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}